

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# signal.h
# Opt level: O3

void __thiscall
rengine::Signal<>::disconnect(Signal<> *this,SignalEmitter *emitter,SignalHandler<> *handler)

{
  SignalBase *__src;
  vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
  *pvVar1;
  BucketBase *pBVar2;
  pointer ppBVar3;
  __normal_iterator<rengine::SignalHandler<>_**,_std::vector<rengine::SignalHandler<>_*,_std::allocator<rengine::SignalHandler<>_*>_>_>
  __dest;
  SignalBase *pSVar4;
  SignalHandler<> *local_18;
  SignalHandler<> *handler_local;
  
  pvVar1 = emitter->m_buckets;
  local_18 = handler;
  if (pvVar1 != (vector<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                 *)0x0) {
    for (ppBVar3 = (pvVar1->
                   super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
                   )._M_impl.super__Vector_impl_data._M_start;
        ppBVar3 !=
        (pvVar1->
        super__Vector_base<rengine::SignalEmitter::BucketBase_*,_std::allocator<rengine::SignalEmitter::BucketBase_*>_>
        )._M_impl.super__Vector_impl_data._M_finish; ppBVar3 = ppBVar3 + 1) {
      pBVar2 = *ppBVar3;
      if (pBVar2->signal == &this->super_SignalBase) {
        __dest = std::
                 __find_if<__gnu_cxx::__normal_iterator<rengine::SignalHandler<>**,std::vector<rengine::SignalHandler<>*,std::allocator<rengine::SignalHandler<>*>>>,__gnu_cxx::__ops::_Iter_equals_val<rengine::SignalHandler<>*const>>
                           (pBVar2[1]._vptr_BucketBase,pBVar2[1].signal,&local_18);
        pSVar4 = pBVar2[1].signal;
        if ((SignalBase *)__dest._M_current != pSVar4) {
          __src = (SignalBase *)(__dest._M_current + 1);
          if (__src != pSVar4) {
            memmove(__dest._M_current,__src,(long)pSVar4 - (long)__src);
            pSVar4 = pBVar2[1].signal;
          }
          pBVar2[1].signal = pSVar4 + -8;
          return;
        }
        __assert_fail("pos != bucket->handlers.end()",
                      "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                      ,0x76,
                      "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
                     );
      }
    }
  }
  __assert_fail("bucket",
                "/workspace/llm4binary/github/license_all_cmakelists_1510/CrimsonAS[P]rengine/include/object/signal.h"
                ,0x74,
                "void rengine::Signal<>::disconnect(SignalEmitter *, SignalHandler<Arguments...> *) [Arguments = <>]"
               );
}

Assistant:

void disconnect(SignalEmitter *emitter, SignalHandler<Arguments ...> *handler)
    {
        Bucket *bucket = findBucket(emitter);
        assert(bucket);
        auto pos = std::find(bucket->handlers.begin(), bucket->handlers.end(), handler);
        assert(pos != bucket->handlers.end());
        bucket->handlers.erase(pos);
    }